

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O2

void __thiscall gepard::SegmentApproximator::~SegmentApproximator(SegmentApproximator *this)

{
  _Base_ptr this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->_segments)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_segments)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = p_Var1[1]._M_parent;
    if (this_00 != (_Base_ptr)0x0) {
      std::__cxx11::_List_base<gepard::Segment,_std::allocator<gepard::Segment>_>::_M_clear
                ((_List_base<gepard::Segment,_std::allocator<gepard::Segment>_> *)this_00);
    }
    operator_delete(this_00);
  }
  std::
  _Rb_tree<const_int,_std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>,_std::_Select1st<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>,_std::less<const_int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>_*>_>_>
  ::~_Rb_tree(&(this->_segments)._M_t);
  return;
}

Assistant:

SegmentApproximator::~SegmentApproximator()
{
    for (SegmentTree::iterator it = _segments.begin(); it != _segments.end(); ++it) {
        delete it->second;
    }
}